

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_reflection_getters
          (t_java_generator *this,ostringstream *out,t_type *type,string *field_name,
          string *cap_name)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_70;
  string local_50;
  string *local_30;
  string *cap_name_local;
  string *field_name_local;
  t_type *type_local;
  ostringstream *out_local;
  t_java_generator *this_local;
  
  local_30 = cap_name;
  cap_name_local = field_name;
  field_name_local = (string *)type;
  type_local = (t_type *)out;
  out_local = (ostringstream *)this;
  poVar2 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  poVar2 = std::operator<<(poVar2,"case ");
  std::__cxx11::string::string((string *)&local_70,(string *)field_name);
  constant_name(&local_50,this,&local_70);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,":");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)type_local);
  poVar2 = std::operator<<(poVar2,"return ");
  bVar1 = (**(code **)(*(long *)field_name_local + 0x40))();
  pcVar3 = "get";
  if ((bVar1 & 1) != 0) {
    pcVar3 = "is";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)cap_name);
  poVar2 = std::operator<<(poVar2,"();");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  return;
}

Assistant:

void t_java_generator::generate_reflection_getters(ostringstream& out,
                                                   t_type* type,
                                                   string field_name,
                                                   string cap_name) {
  indent(out) << "case " << constant_name(field_name) << ":" << endl;
  indent_up();
  indent(out) << "return " << (type->is_bool() ? "is" : "get") << cap_name << "();" << endl << endl;
  indent_down();
}